

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O2

void pybind11::detail::clear_instance(PyObject *self)

{
  pointer pptVar1;
  pointer pptVar2;
  PyObject *op;
  bool bVar3;
  undefined8 *puVar4;
  iterator __begin2;
  instance *in_stack_ffffffffffffffb0;
  size_t local_48;
  type_info *local_40;
  void **local_38;
  values_and_holders local_30;
  
  local_30.inst = (instance *)self;
  local_30.tinfo = all_type_info(self->ob_type);
  values_and_holders::begin((iterator *)&stack0xffffffffffffffa0,&local_30);
  pptVar1 = ((local_30.tinfo)->
            super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  pptVar2 = ((local_30.tinfo)->
            super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  do {
    if (local_48 == (long)pptVar1 - (long)pptVar2 >> 3) {
      instance::deallocate_layout((instance *)self);
      if (self[2].ob_type != (PyTypeObject *)0x0) {
        PyObject_ClearWeakRefs(self);
      }
      puVar4 = (undefined8 *)_PyObject_GetDictPtr(self);
      if ((puVar4 != (undefined8 *)0x0) && (op = (PyObject *)*puVar4, op != (PyObject *)0x0)) {
        *puVar4 = 0;
        _Py_DECREF(op);
      }
      if ((self[3].ob_refcnt & 0x10) != 0) {
        clear_patients(&in_stack_ffffffffffffffb0->ob_base);
      }
      return;
    }
    if (*local_38 != (void *)0x0) {
      bVar3 = value_and_holder::instance_registered((value_and_holder *)&stack0xffffffffffffffb0);
      if (bVar3) {
        bVar3 = deregister_instance((instance *)self,*local_38,local_40);
        if (!bVar3) {
          pybind11_fail("pybind11_object_dealloc(): Tried to deallocate unregistered instance!");
        }
      }
      if ((self[3].ob_refcnt & 1) == 0) {
        bVar3 = value_and_holder::holder_constructed((value_and_holder *)&stack0xffffffffffffffb0);
        if (!bVar3) goto LAB_00112f45;
      }
      (*local_40->dealloc)((value_and_holder *)&stack0xffffffffffffffb0);
    }
LAB_00112f45:
    values_and_holders::iterator::operator++((iterator *)&stack0xffffffffffffffa0);
  } while( true );
}

Assistant:

inline void clear_instance(PyObject *self) {
    auto instance = reinterpret_cast<detail::instance *>(self);

    // Deallocate any values/holders, if present:
    for (auto &v_h : values_and_holders(instance)) {
        if (v_h) {

            // We have to deregister before we call dealloc because, for virtual MI types, we still
            // need to be able to get the parent pointers.
            if (v_h.instance_registered() && !deregister_instance(instance, v_h.value_ptr(), v_h.type))
                pybind11_fail("pybind11_object_dealloc(): Tried to deallocate unregistered instance!");

            if (instance->owned || v_h.holder_constructed())
                v_h.type->dealloc(v_h);
        }
    }
    // Deallocate the value/holder layout internals:
    instance->deallocate_layout();

    if (instance->weakrefs)
        PyObject_ClearWeakRefs(self);

    PyObject **dict_ptr = _PyObject_GetDictPtr(self);
    if (dict_ptr)
        Py_CLEAR(*dict_ptr);

    if (instance->has_patients)
        clear_patients(self);
}